

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::FactorAddMulsOpnds
               (uint32_t factor0_0,uint32_t factor0_1,uint32_t factor1_0,uint32_t factor1_1,
               Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  Analysis preserved_analyses;
  uint32_t type_id;
  Op OVar1;
  Op OVar2;
  IRContext *context_00;
  Operand *local_168;
  allocator<spvtools::opt::Operand> local_15d;
  uint32_t local_15c;
  iterator local_158;
  undefined8 local_150;
  SmallVector<unsigned_int,_2UL> local_148;
  uint32_t local_11c;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  Operand local_e0;
  Operand OStack_b0;
  iterator local_80;
  _func_int **local_78;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_70;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  Instruction *new_add_inst;
  InstructionBuilder ir_builder;
  IRContext *context;
  Instruction *inst_local;
  uint32_t factor1_1_local;
  uint32_t factor1_0_local;
  uint32_t factor0_1_local;
  uint32_t factor0_0_local;
  
  context_00 = Instruction::context(inst);
  if (factor0_0 == factor1_0) {
    ir_builder._24_8_ = context_00;
    preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)&new_add_inst,context_00,inst,preserved_analyses);
    type_id = Instruction::type_id(inst);
    OVar1 = Instruction::opcode(inst);
    local_58._M_head_impl =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         InstructionBuilder::AddBinaryOp
                   ((InstructionBuilder *)&new_add_inst,type_id,OVar1,factor0_1,factor1_1);
    OVar2 = Instruction::opcode(inst);
    OVar1 = OpIMul;
    if (OVar2 == OpFAdd) {
      OVar1 = OpFMul;
    }
    Instruction::SetOpcode(inst,OVar1);
    local_118 = &local_11c;
    local_110 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_118;
    local_11c = factor0_0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list_00);
    Operand::Operand(&local_e0,SPV_OPERAND_TYPE_ID,&local_108);
    local_15c = Instruction::result_id((Instruction *)local_58._M_head_impl);
    local_158 = &local_15c;
    local_150 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_158;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_148,init_list);
    Operand::Operand(&OStack_b0,SPV_OPERAND_TYPE_ID,&local_148);
    local_80 = &local_e0;
    local_78 = (_func_int **)0x2;
    std::allocator<spvtools::opt::Operand>::allocator(&local_15d);
    __l._M_len = (size_type)local_78;
    __l._M_array = local_80;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_70,__l,&local_15d);
    Instruction::SetInOperands(inst,&local_70);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_70)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator(&local_15d);
    local_168 = (Operand *)&local_80;
    do {
      local_168 = local_168 + -1;
      Operand::~Operand(local_168);
    } while (local_168 != &local_e0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_148);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
    IRContext::UpdateDefUse((IRContext *)ir_builder._24_8_,inst);
    factor0_1_local._3_1_ = true;
  }
  else {
    factor0_1_local._3_1_ = false;
  }
  return factor0_1_local._3_1_;
}

Assistant:

bool FactorAddMulsOpnds(uint32_t factor0_0, uint32_t factor0_1,
                        uint32_t factor1_0, uint32_t factor1_1,
                        Instruction* inst) {
  IRContext* context = inst->context();
  if (factor0_0 != factor1_0) return false;
  InstructionBuilder ir_builder(
      context, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* new_add_inst = ir_builder.AddBinaryOp(
      inst->type_id(), inst->opcode(), factor0_1, factor1_1);
  inst->SetOpcode(inst->opcode() == spv::Op::OpFAdd ? spv::Op::OpFMul
                                                    : spv::Op::OpIMul);
  inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {factor0_0}},
                       {SPV_OPERAND_TYPE_ID, {new_add_inst->result_id()}}});
  context->UpdateDefUse(inst);
  return true;
}